

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O0

void __thiscall cashew::ValueBuilder::appendToVar(ValueBuilder *this,Ref var,IString name,Ref value)

{
  bool bVar1;
  Ref *pRVar2;
  Value *pVVar3;
  Ref r;
  Ref local_38;
  Ref local_30;
  Ref array;
  Ref value_local;
  IString name_local;
  Ref var_local;
  
  array.inst = (Value *)name.str._M_str;
  name_local.str._M_len = name.str._M_len;
  value_local = var;
  name_local.str._M_str = (char *)this;
  pRVar2 = Ref::operator[]((Ref *)&name_local.str._M_str,0);
  bVar1 = Ref::operator==(pRVar2,(IString *)VAR);
  if (!bVar1) {
    __assert_fail("var[0] == VAR",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/emscripten-optimizer/simple_ast.h"
                  ,0x688,"static void cashew::ValueBuilder::appendToVar(Ref, IString, Ref)");
  }
  local_38 = makeRawArray(1);
  pVVar3 = Ref::operator->(&local_38);
  r = makeRawString((IString *)&value_local);
  pVVar3 = cashew::Value::push_back(pVVar3,r);
  Ref::Ref(&local_30,pVVar3);
  bVar1 = Ref::operator!(&array);
  if (!bVar1) {
    pVVar3 = Ref::operator->(&local_30);
    cashew::Value::push_back(pVVar3,array);
  }
  pRVar2 = Ref::operator[]((Ref *)&name_local.str._M_str,1);
  pVVar3 = Ref::operator->(pRVar2);
  cashew::Value::push_back(pVVar3,local_30);
  return;
}

Assistant:

static void appendToVar(Ref var, IString name, Ref value) {
    assert(var[0] == VAR);
    Ref array = &makeRawArray(1)->push_back(makeRawString(name));
    if (!!value) {
      array->push_back(value);
    }
    var[1]->push_back(array);
  }